

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeep.cpp
# Opt level: O0

bool __thiscall libDAI::TreeEP::initProps2(TreeEP *this)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  unsigned_long uVar4;
  undefined8 uVar5;
  long in_RDI;
  char *__s;
  InferenceAlgorithm *in_stack_fffffffffffffda8;
  InferenceAlgorithm *in_stack_fffffffffffffdb0;
  allocator<char> *in_stack_fffffffffffffde0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string *msg;
  undefined6 in_stack_fffffffffffffe28;
  Exception *this_01;
  allocator<char> local_181;
  string local_180 [39];
  allocator<char> local_159;
  string local_158 [39];
  allocator<char> local_131;
  string local_130 [39];
  undefined1 local_109 [40];
  allocator<char> local_e1;
  string local_e0 [32];
  value local_c0;
  allocator<char> local_b9;
  string local_b8 [39];
  undefined1 local_91 [40];
  undefined1 local_69 [56];
  allocator<char> local_31;
  string local_30 [47];
  bool local_1;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  bVar1 = InferenceAlgorithm::HasProperty
                    (in_stack_fffffffffffffdb0,(PropertyKey *)in_stack_fffffffffffffda8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_01 = (Exception *)local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    uVar2 = InferenceAlgorithm::HasProperty
                      (in_stack_fffffffffffffdb0,(PropertyKey *)in_stack_fffffffffffffda8);
    bVar3 = uVar2 ^ 0xff;
    std::__cxx11::string::~string((string *)(local_69 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_69);
    if ((bVar3 & 1) == 0) {
      msg = (string *)local_91;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      bVar1 = InferenceAlgorithm::HasProperty
                        (in_stack_fffffffffffffdb0,(PropertyKey *)in_stack_fffffffffffffda8);
      std::__cxx11::string::~string((string *)(local_91 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_91);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
        bVar1 = InferenceAlgorithm::HasProperty
                          (in_stack_fffffffffffffdb0,(PropertyKey *)in_stack_fffffffffffffda8);
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator(&local_b9);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
          local_c0 = (value)InferenceAlgorithm::FromStringTo<libDAI::TreeEP::TypeType>
                                      (in_stack_fffffffffffffda8,(PropertyKey *)0xb96ce5);
          *(value *)(in_RDI + 0x260) = local_c0;
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator(&local_e1);
          this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_109;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this_00,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
          __s = (char *)InferenceAlgorithm::FromStringTo<double>
                                  (in_stack_fffffffffffffdb0,
                                   (PropertyKey *)in_stack_fffffffffffffda8);
          *(char **)(in_RDI + 0x268) = __s;
          std::__cxx11::string::~string((string *)(local_109 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_109);
          __a = &local_131;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
          uVar4 = InferenceAlgorithm::FromStringTo<unsigned_long>
                            (in_stack_fffffffffffffdb0,(PropertyKey *)in_stack_fffffffffffffda8);
          *(unsigned_long *)(in_RDI + 0x270) = uVar4;
          std::__cxx11::string::~string(local_130);
          std::allocator<char>::~allocator(&local_131);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
          uVar4 = InferenceAlgorithm::FromStringTo<unsigned_long>
                            (in_stack_fffffffffffffdb0,(PropertyKey *)in_stack_fffffffffffffda8);
          *(unsigned_long *)(in_RDI + 0x278) = uVar4;
          std::__cxx11::string::~string(local_158);
          std::allocator<char>::~allocator(&local_159);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
          bVar1 = InferenceAlgorithm::HasProperty
                            (in_stack_fffffffffffffdb0,(PropertyKey *)in_stack_fffffffffffffda8);
          std::__cxx11::string::~string(local_180);
          std::allocator<char>::~allocator(&local_181);
          if (bVar1) {
            uVar5 = __cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
            Exception::Exception
                      (this_01,CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffe28)),msg);
            __cxa_throw(uVar5,&Exception::typeinfo,Exception::~Exception);
          }
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool TreeEP::initProps2() {
        if( !HasProperty("type") )
            return false;
        if( !HasProperty("tol") )
            return false;
        if( !HasProperty("maxiter") )
            return false;
        if( !HasProperty("verbose") )
            return false;
        
        Props2.type    = FromStringTo<TypeType>("type");
        Props2.tol     = FromStringTo<double>("tol");
        Props2.maxiter = FromStringTo<size_t>("maxiter");
        Props2.verbose = FromStringTo<size_t>("verbose");
        if( HasProperty("damping") )
            DAI_THROW( NOT_IMPLEMENTED );

        return true;
    }